

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O2

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::BrokerApp::generateParser(BrokerApp *this,bool noTypeOption)

{
  App *this_00;
  int in_EDX;
  undefined7 in_register_00000031;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  std::make_unique<helics::helicsCLI11App,char_const(&)[19]>((char (*) [19])this);
  if (in_EDX == 0) {
    helicsCLI11App::addTypeOption
              ((helicsCLI11App *)
               (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               true);
  }
  if (*(long *)(CONCAT71(in_register_00000031,noTypeOption) + 0x18) == 0) {
    this_00 = (App *)(this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"--name,-n",&local_81);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"name of the broker",&local_82);
    CLI::App::
    add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
              (this_00,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT71(in_register_00000031,noTypeOption) + 0x10),&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  local_40._M_unused._M_object =
       (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined1 *)&((element_type *)((long)local_40._M_unused._0_8_ + 0x48))->_vptr_Broker = 1;
  local_40._8_8_ = 0;
  local_28 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/BrokerApp.cpp:147:17)>
             ::_M_invoke;
  local_30 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/BrokerApp.cpp:147:17)>
             ::_M_manager;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)((long)local_40._M_unused._0_8_ + 0x150),
            (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)&local_40);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<helicsCLI11App> BrokerApp::generateParser(bool noTypeOption)
{
    auto app = std::make_unique<helicsCLI11App>("Broker application");
    if (!noTypeOption) {
        app->addTypeOption();
    }

    if (name.empty()) {
        app->add_option("--name,-n", name, "name of the broker");
    }
    app->allow_extras();
    auto* app_p = app.get();
    app->footer([app_p]() {
        auto coreType = coreTypeFromString((*app_p)["--coretype"]->as<std::string>());
        BrokerFactory::displayHelp(coreType);
        return std::string();
    });
    return app;
}